

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureCubeSizeCase::init(TextureCubeSizeCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  TextureCube *this_00;
  uint uVar2;
  long lVar3;
  TextureCube *ctx_00;
  int face;
  long lVar4;
  ulong uVar5;
  Vec4 (*minVal) [2];
  
  this_00 = (TextureCube *)operator_new(0x180);
  ctx_00 = this_00;
  glu::TextureCube::TextureCube
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width);
  this->m_texture = this_00;
  if (init()::gradients == '\0') {
    init((EVP_PKEY_CTX *)ctx_00);
  }
  uVar2 = 1;
  if (this->m_useMipmaps == true) {
    uVar1 = this->m_height;
    if (this->m_height < this->m_width) {
      uVar1 = this->m_width;
    }
    uVar2 = 0x20;
    if (uVar1 != 0) {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    if (uVar1 == 0) goto LAB_00f496b4;
    uVar2 = 0x20 - uVar2;
  }
  uVar5 = 0;
  do {
    lVar3 = 0xb0;
    minVal = init::gradients;
    lVar4 = 0;
    do {
      tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)lVar4,(int)uVar5);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 (*(long *)((long)(this->m_texture->m_refTexture).m_data + lVar3 + -0x20) +
                 uVar5 * 0x28),*minVal,(Vec4 *)((long)minVal + 0x10));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x18;
      minVal = (Vec4 (*) [2])((long)minVal + 0x20);
    } while (lVar4 != 6);
    uVar5 = uVar5 + 1;
  } while (uVar5 != uVar2);
LAB_00f496b4:
  glu::TextureCube::upload(this->m_texture);
  this->m_curFace = 0;
  this->m_isOk = true;
  return extraout_EAX;
}

Assistant:

void TextureCubeSizeCase::init (void)
{
	DE_ASSERT(!m_texture);
	DE_ASSERT(m_width == m_height);
	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_width);

	static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
	{
		{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
		{ tcu::Vec4( 0.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
		{ tcu::Vec4(-1.0f,  0.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
		{ tcu::Vec4(-1.0f, -1.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
		{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
	};

	int numLevels = m_useMipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;

	// Fill levels.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			m_texture->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
			fillWithComponentGradients(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0], gradients[face][1]);
		}
	}

	// Upload texture data to GL.
	m_texture->upload();

	// Initialize iteration state.
	m_curFace	= 0;
	m_isOk		= true;
}